

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall icu_63::VTimeZone::VTimeZone(VTimeZone *this,VTimeZone *source)

{
  UnicodeString *this_00;
  int iVar1;
  undefined4 extraout_var;
  UVector *pUVar2;
  long *plVar3;
  void *obj;
  int32_t initialCapacity;
  UnicodeString *that;
  UErrorCode status;
  UnicodeString *local_48;
  UnicodeString *local_40;
  UnicodeString *local_38;
  
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,&source->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__VTimeZone_003a2760;
  this->tz = (BasicTimeZone *)0x0;
  this->vtzlines = (UVector *)0x0;
  UnicodeString::UnicodeString(&this->tzurl,&source->tzurl);
  this->lastmod = source->lastmod;
  this_00 = &this->olsonzid;
  UnicodeString::UnicodeString(this_00,&source->olsonzid);
  that = &source->icutzver;
  UnicodeString::UnicodeString(&this->icutzver,that);
  if (source->tz != (BasicTimeZone *)0x0) {
    iVar1 = (*(source->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
    this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar1);
  }
  if (source->vtzlines == (UVector *)0x0) {
    return;
  }
  status = U_ZERO_ERROR;
  initialCapacity = source->vtzlines->count;
  local_48 = &this->tzurl;
  local_38 = &this->icutzver;
  pUVar2 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)that);
  local_40 = this_00;
  if (pUVar2 == (UVector *)0x0) {
    this->vtzlines = (UVector *)0x0;
  }
  else {
    UVector::UVector(pUVar2,uprv_deleteUObject_63,uhash_compareUnicodeString_63,initialCapacity,
                     &status);
    this->vtzlines = pUVar2;
    if (U_ZERO_ERROR < status) goto LAB_0020e25b;
  }
  iVar1 = 0;
  if (initialCapacity < 1) {
    initialCapacity = 0;
  }
  do {
    if (initialCapacity == iVar1) {
      return;
    }
    plVar3 = (long *)UVector::elementAt(source->vtzlines,iVar1);
    pUVar2 = this->vtzlines;
    obj = (void *)(**(code **)(*plVar3 + 0x38))(plVar3);
    UVector::addElement(pUVar2,obj,&status);
    iVar1 = iVar1 + 1;
  } while (status < U_ILLEGAL_ARGUMENT_ERROR);
  pUVar2 = this->vtzlines;
  if (pUVar2 == (UVector *)0x0) {
    return;
  }
LAB_0020e25b:
  (*(pUVar2->super_UObject)._vptr_UObject[1])(pUVar2);
  return;
}

Assistant:

VTimeZone::VTimeZone(const VTimeZone& source)
:   BasicTimeZone(source), tz(NULL), vtzlines(NULL),
    tzurl(source.tzurl), lastmod(source.lastmod),
    olsonzid(source.olsonzid), icutzver(source.icutzver) {
    if (source.tz != NULL) {
        tz = (BasicTimeZone*)source.tz->clone();
    }
    if (source.vtzlines != NULL) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = source.vtzlines->size();
        vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
        if (U_SUCCESS(status)) {
            for (int32_t i = 0; i < size; i++) {
                UnicodeString *line = (UnicodeString*)source.vtzlines->elementAt(i);
                vtzlines->addElement(line->clone(), status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        if (U_FAILURE(status) && vtzlines != NULL) {
            delete vtzlines;
        }
    }
}